

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O2

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<double>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>_>_>
                    *value)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  istream *piVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong local_60;
  ulong local_48;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar3 = std::istream::peek();
      iVar3 = isspace(iVar3);
      if (iVar3 == 0) break;
      std::istream::get();
    }
  }
  iVar3 = std::istream::peek();
  if ((iVar3 == 0x2d) || (iVar3 == 0x30)) {
    iVar4 = iVar3;
    if (iVar3 == 0x2d) {
      std::istream::get();
      iVar4 = std::istream::peek();
    }
    if (iVar4 == 0x30) {
      std::istream::get();
      uVar5 = std::istream::peek();
      if ((uVar5 & 0xffffffdf) == 0x58) {
        do {
          std::istream::get();
          uVar5 = std::istream::peek();
        } while (uVar5 == 0x30);
        lVar11 = 0x3ff;
        uVar14 = 0;
        bVar13 = false;
        bVar1 = 0;
        local_60 = 0;
        bVar16 = false;
        bVar18 = false;
        while ((!bVar16 && (!bVar18))) {
          if (uVar5 == 0x2e) {
            bVar16 = true;
          }
          else if (uVar5 == 0x70) {
            bVar18 = true;
            bVar16 = false;
          }
          else {
            iVar4 = isxdigit(uVar5);
            if (iVar4 == 0) goto LAB_001981d3;
            bVar1 = get_nibble_from_character(uVar5);
            uVar5 = (uint)bVar1;
            iVar4 = 4;
            while (bVar16 = iVar4 != 0, iVar4 = iVar4 + -1, bVar16) {
              uVar7 = uVar14;
              if (bVar13) {
                if (lVar11 == 0x7fffffffffffffff) goto LAB_001981d3;
                uVar7 = uVar14 + 1;
                if (uVar14 + 1 == 0) {
                  uVar7 = 0xffffffffffffffff;
                }
                uVar10 = (ulong)((uVar5 & 8) >> 3) << (~(byte)uVar14 & 0x3f);
                if ((uVar5 & 8) == 0) {
                  uVar10 = 0;
                }
                if (0x3f < uVar14) {
                  uVar10 = 0;
                }
                local_60 = local_60 | uVar10;
                lVar11 = lVar11 + 1;
              }
              bVar13 = (bool)(bVar13 | (uVar5 & 8) != 0);
              uVar5 = uVar5 * 2;
              uVar14 = uVar7;
            }
            bVar16 = false;
            bVar1 = 1;
          }
          std::istream::get();
          uVar5 = std::istream::peek();
        }
        local_48 = 0x8000000000000000;
        uVar8 = 0;
        while (uVar7 = (ulong)uVar5, !(bool)(bVar16 ^ 1U | bVar18)) {
          bVar13 = true;
          if (uVar5 != 0x70) {
            iVar4 = isxdigit(uVar5);
            if (iVar4 == 0) goto LAB_001981d3;
            bVar2 = get_nibble_from_character(uVar5);
            uVar5 = (uint)bVar2;
            iVar4 = 4;
            while (bVar17 = iVar4 != 0, iVar4 = iVar4 + -1, bVar13 = bVar18, bVar17) {
              uVar9 = uVar5 >> 3 & 1;
              uVar8 = uVar8 | uVar9;
              if ((bVar1 == 0) && (uVar8 == 0)) {
                if (lVar11 == -0x8000000000000000) goto LAB_001981d3;
                lVar11 = lVar11 + -1;
              }
              else {
                uVar7 = (ulong)uVar9 << (~(byte)uVar14 & 0x3f);
                if (uVar9 == 0) {
                  uVar7 = 0;
                }
                if (0x3f < uVar14) {
                  uVar7 = 0;
                }
                local_60 = local_60 | uVar7;
                uVar14 = uVar14 + 1;
                if (uVar14 == 0) {
                  uVar14 = 0xffffffffffffffff;
                }
              }
              uVar5 = uVar5 * 2;
            }
          }
          bVar18 = bVar13;
          std::istream::get();
          uVar5 = std::istream::peek();
        }
        bVar2 = 1;
        bVar18 = false;
        bVar16 = false;
        lVar15 = 0;
        do {
          iVar4 = (int)uVar7;
          if (bVar16) {
            if (9 < iVar4 - 0x30U) {
              lVar15 = lVar15 * (char)bVar2;
              if ((lVar15 < 0) || (lVar11 < 0)) {
                if ((lVar15 < 0) && (lVar11 < 0)) {
                  lVar12 = lVar11 + 0x7ffffffffffffffe;
                  uVar14 = lVar15 + lVar11;
                  if (lVar12 == -lVar15 || SBORROW8(lVar12,-lVar15) != lVar12 + lVar15 < 0) {
                    uVar14 = 0x8000000000000002;
                  }
                }
                else {
                  uVar14 = lVar15 + lVar11;
                }
              }
              else {
                uVar14 = lVar11 + lVar15;
                if (0x7ffffffffffffffe - lVar11 <= lVar15) {
                  uVar14 = 0x7ffffffffffffffe;
                }
              }
              bVar16 = local_60 == 0;
              local_60 = local_60 << ~(bVar1 | bVar16);
              bVar18 = (bool)(~bVar1 & bVar16);
              uVar7 = 0;
              if (!bVar18) {
                uVar7 = uVar14;
              }
              uVar10 = (local_60 >> 1) + 0x8000000000000000;
              if (bVar18) {
                uVar10 = local_60;
              }
              if (bVar1 == 0 && !bVar16) {
                uVar7 = uVar14 - 1;
              }
              if (0 < (long)uVar7) {
                uVar10 = local_60;
              }
              uVar14 = uVar10 >> 0xc;
              while (((long)uVar7 < 0 && (!bVar18))) {
                uVar10 = uVar14 >> 1;
                uVar7 = uVar7 + 1;
                bVar18 = uVar14 < 2;
                uVar14 = uVar10;
                if (bVar18) {
                  uVar7 = 0;
                }
              }
              uVar10 = 0x7ff;
              if ((long)uVar7 < 0x7ff) {
                uVar10 = uVar7;
              }
              if (0x7ff < (long)uVar7) {
                uVar14 = 0;
              }
              if (iVar3 != 0x2d) {
                local_48 = 0;
              }
              (value->value_).data_ = (uVar10 & 0x7ff) << 0x34 | local_48 | uVar14;
              return is;
            }
LAB_00198189:
            lVar12 = lVar15 * 10 + -0x30 + uVar7;
            if ((long)((0x800000000000002e - uVar7) / 10) <= lVar15) {
              lVar12 = 0x7ffffffffffffffe;
            }
            bVar16 = true;
            lVar15 = lVar12;
          }
          else {
            if ((iVar4 != 0x2d) && (iVar4 != 0x2b)) {
              if (iVar4 - 0x30U < 10) goto LAB_00198189;
LAB_001981d3:
              std::ios::setstate((int)*(undefined8 *)(*(long *)is + -0x18) + (int)is);
              return is;
            }
            if (bVar18) goto LAB_001981d3;
            bVar2 = -(iVar4 == 0x2d) | 1;
            bVar18 = true;
            bVar16 = false;
          }
          std::istream::get();
          uVar7 = std::istream::peek();
          uVar7 = uVar7 & 0xffffffff;
        } while( true );
      }
      bVar18 = iVar3 == 0x2d;
      std::istream::unget();
    }
    else {
      bVar18 = iVar3 == 0x2d;
    }
  }
  else {
    bVar18 = false;
  }
  piVar6 = ParseNormalFloat<spvtools::utils::FloatProxy<double>,spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<double>>>
                     (is,bVar18,value);
  return piVar6;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}